

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O2

void * dlmalloc(size_t bytes)

{
  size_t *psVar1;
  byte *pbVar2;
  malloc_tree_chunk *pmVar3;
  char *pcVar4;
  tbinptr pmVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  binmap_t bVar8;
  char *pcVar9;
  tbinptr pmVar10;
  char *pcVar11;
  tbinptr pmVar12;
  mstate m;
  malloc_segment *pmVar13;
  msegmentptr pmVar14;
  int *piVar15;
  sbinptr bin;
  mchunkptr pmVar16;
  mchunkptr pmVar17;
  ulong uVar18;
  long lVar19;
  malloc_tree_chunk **ppmVar20;
  malloc_chunk *pmVar21;
  size_t dvs;
  size_t extraout_RDX;
  size_t sVar22;
  size_t psize;
  ulong uVar23;
  mstate pmVar24;
  tbinptr pmVar25;
  mchunkptr pmVar26;
  tbinptr pmVar27;
  byte bVar28;
  binmap_t bVar29;
  tchunkptr TP;
  malloc_chunk *pmVar30;
  uint uVar31;
  malloc_chunk *pmVar32;
  long lVar33;
  uint uVar34;
  malloc_tree_chunk *pmVar35;
  ulong uVar36;
  byte bVar37;
  malloc_tree_chunk **ppmVar38;
  mchunkptr pmVar39;
  mstate pmVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  mstate addr;
  
  sVar22 = _gm_.dvsize;
  bVar8 = _gm_.treemap;
  bVar29 = _gm_.smallmap;
  if (bytes < 0xe9) {
    pmVar40 = (mstate)&DAT_00000020;
    if (0x16 < bytes) {
      pmVar40 = (mstate)(ulong)((int)bytes + 0x17U & 0x1f0);
    }
    bVar37 = (byte)((ulong)pmVar40 >> 3);
    uVar31 = _gm_.smallmap >> (bVar37 & 0x1f);
    if ((uVar31 & 3) != 0) {
      uVar31 = (uVar31 & 1 | (uint)((ulong)pmVar40 >> 3)) ^ 1;
      uVar18 = (ulong)(uVar31 << 4);
      pcVar9 = (char *)((long)_gm_.smallbins + uVar18);
      lVar33 = *(long *)((long)_gm_.smallbins + uVar18 + 0x10);
      pcVar11 = *(char **)(lVar33 + 0x10);
      if (pcVar9 == pcVar11) {
        _gm_.smallmap = _gm_.smallmap & ~(1 << (uVar31 & 0x1f));
      }
      else {
        if ((pcVar11 < _gm_.least_addr) || (*(long *)(pcVar11 + 0x18) != lVar33)) goto LAB_00105669;
        *(char **)(pcVar11 + 0x18) = pcVar9;
        *(char **)((long)_gm_.smallbins + uVar18 + 0x10) = pcVar11;
      }
      *(ulong *)(lVar33 + 8) = (ulong)(uVar31 << 3) + 3;
      pbVar2 = (byte *)(lVar33 + 8 + (ulong)(uVar31 << 3));
      *pbVar2 = *pbVar2 | 1;
      return (malloc_tree_chunk **)(lVar33 + 0x10);
    }
    if (_gm_.dvsize < pmVar40) {
      if (uVar31 != 0) {
        uVar34 = 2 << (bVar37 & 0x1f);
        uVar34 = (-uVar34 | uVar34) & uVar31 << (bVar37 & 0x1f);
        uVar31 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        uVar18 = (ulong)(uVar31 << 4);
        pcVar9 = (char *)((long)_gm_.smallbins + uVar18);
        lVar33 = *(long *)((long)_gm_.smallbins + uVar18 + 0x10);
        pcVar11 = *(char **)(lVar33 + 0x10);
        if (pcVar9 == pcVar11) {
          bVar29 = _gm_.smallmap & ~(1 << (uVar31 & 0x1f));
          _gm_.smallmap = bVar29;
        }
        else {
          if ((pcVar11 < _gm_.least_addr) || (*(long *)(pcVar11 + 0x18) != lVar33))
          goto LAB_00105669;
          *(char **)(pcVar11 + 0x18) = pcVar9;
          *(char **)((long)_gm_.smallbins + uVar18 + 0x10) = pcVar11;
        }
        uVar18 = (ulong)(uVar31 << 3);
        uVar36 = uVar18 - (long)pmVar40;
        if (uVar36 < 0x20) {
          *(ulong *)(lVar33 + 8) = uVar18 | 3;
          pbVar2 = (byte *)(lVar33 + 8 + uVar18);
          *pbVar2 = *pbVar2 | 1;
          return (malloc_tree_chunk **)(lVar33 + 0x10);
        }
        *(ulong *)(lVar33 + 8) = (ulong)pmVar40 | 3;
        *(ulong *)((long)pmVar40->smallbins + lVar33 + -0x40) = uVar36 | 1;
        *(ulong *)(lVar33 + uVar18) = uVar36;
        if (sVar22 != 0) {
          uVar31 = (uint)(sVar22 >> 3);
          uVar18 = (ulong)(uVar31 * 2);
          if ((bVar29 >> (uVar31 & 0x1f) & 1) == 0) {
            _gm_.smallmap = bVar29 | 1 << ((byte)(sVar22 >> 3) & 0x1f);
            pmVar16 = (mchunkptr)(_gm_.smallbins + uVar18);
          }
          else {
            pmVar16 = _gm_.smallbins[uVar18 + 2];
            if (_gm_.smallbins[uVar18 + 2] < _gm_.least_addr) goto LAB_00105669;
          }
          _gm_.smallbins[uVar18 + 2] = _gm_.dv;
          pmVar16->bk = _gm_.dv;
          (_gm_.dv)->fd = pmVar16;
          (_gm_.dv)->bk = (mchunkptr)(_gm_.smallbins + uVar18);
        }
        _gm_.dvsize = uVar36;
        _gm_.dv = (mchunkptr)((long)pmVar40->smallbins + lVar33 + -0x48);
        return (malloc_tree_chunk **)(lVar33 + 0x10);
      }
      if (_gm_.treemap != 0) {
        uVar31 = 0;
        if (_gm_.treemap != 0) {
          for (; (_gm_.treemap >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        pmVar12 = _gm_.treebins[uVar31];
        uVar18 = (pmVar12->head & 0xfffffffffffffff8) - (long)pmVar40;
        pmVar25 = pmVar12;
        while ((pmVar35 = pmVar25->child[0], pmVar35 != (malloc_tree_chunk *)0x0 ||
               (pmVar35 = pmVar25->child[1], pmVar35 != (malloc_tree_chunk *)0x0))) {
          uVar36 = (pmVar35->head & 0xfffffffffffffff8) - (long)pmVar40;
          pmVar25 = pmVar35;
          if (uVar36 < uVar18) {
            pmVar12 = pmVar35;
            uVar18 = uVar36;
          }
        }
        if (pmVar12 < _gm_.least_addr) goto LAB_00105669;
        pmVar25 = pmVar12->bk;
        pmVar35 = pmVar12->parent;
        if (pmVar25 == pmVar12) {
          if (pmVar12->child[1] == (tbinptr)0x0) {
            if (pmVar12->child[0] == (tbinptr)0x0) {
              pmVar25 = (tbinptr)0x0;
              goto LAB_001047c9;
            }
            pmVar27 = pmVar12->child[0];
            ppmVar20 = pmVar12->child;
          }
          else {
            pmVar27 = pmVar12->child[1];
            ppmVar20 = pmVar12->child + 1;
          }
          do {
            do {
              ppmVar38 = ppmVar20;
              pmVar25 = pmVar27;
              pmVar27 = pmVar25->child[1];
              ppmVar20 = pmVar25->child + 1;
            } while (pmVar25->child[1] != (malloc_tree_chunk *)0x0);
            pmVar27 = pmVar25->child[0];
            ppmVar20 = pmVar25->child;
          } while (pmVar25->child[0] != (malloc_tree_chunk *)0x0);
          if (ppmVar38 < _gm_.least_addr) goto LAB_00105669;
          *ppmVar38 = (malloc_tree_chunk *)0x0;
        }
        else {
          pmVar3 = pmVar12->fd;
          if (((pmVar3 < _gm_.least_addr) || (pmVar3->bk != pmVar12)) || (pmVar25->fd != pmVar12))
          goto LAB_00105669;
          pmVar3->bk = pmVar25;
          pmVar25->fd = pmVar3;
        }
LAB_001047c9:
        pmVar27 = (tbinptr)_gm_.least_addr;
        if (pmVar35 != (malloc_tree_chunk *)0x0) {
          uVar31 = pmVar12->index;
          if (pmVar12 == _gm_.treebins[uVar31]) {
            _gm_.treebins[uVar31] = pmVar25;
            pmVar27 = (tbinptr)_gm_.least_addr;
            if (pmVar25 == (tbinptr)0x0) {
              _gm_.treemap = bVar8 & ~(1 << (uVar31 & 0x1f));
            }
            else {
LAB_0010481b:
              if (pmVar25 < pmVar27) goto LAB_00105669;
              pmVar25->parent = pmVar35;
              pmVar10 = pmVar12->child[0];
              if (pmVar10 != (tbinptr)0x0) {
                if (pmVar10 < pmVar27) goto LAB_00105669;
                pmVar25->child[0] = pmVar10;
                pmVar10->parent = pmVar25;
              }
              pmVar10 = pmVar12->child[1];
              if (pmVar10 != (tbinptr)0x0) {
                if (pmVar10 < pmVar27) goto LAB_00105669;
                pmVar25->child[1] = pmVar10;
                pmVar10->parent = pmVar25;
              }
            }
          }
          else {
            if (pmVar35 < _gm_.least_addr) goto LAB_00105669;
            pmVar35->child[pmVar35->child[0] != pmVar12] = pmVar25;
            if (pmVar25 != (tbinptr)0x0) goto LAB_0010481b;
          }
        }
        if (uVar18 < 0x20) {
          uVar18 = (long)pmVar40->smallbins + (uVar18 - 0x48);
          pmVar12->head = uVar18 | 3;
          pbVar2 = (byte *)((long)&pmVar12[-1].prev_foot + uVar18 + 0x48);
          *pbVar2 = *pbVar2 | 1;
          uVar18 = _gm_.dvsize;
          pmVar16 = _gm_.dv;
        }
        else {
          pmVar16 = (mchunkptr)((long)pmVar40->smallbins + (long)&pmVar12[-2].index);
          pmVar12->head = (ulong)pmVar40 | 3;
          *(ulong *)((long)&pmVar12->head + (long)pmVar40) = uVar18 | 1;
          *(ulong *)((long)&pmVar16->prev_foot + uVar18) = uVar18;
          if (sVar22 == 0) goto LAB_00104917;
          uVar31 = (uint)(sVar22 >> 3);
          uVar36 = (ulong)(uVar31 * 2);
          if ((bVar29 >> (uVar31 & 0x1f) & 1) == 0) {
            _gm_.smallmap = 1 << ((byte)(sVar22 >> 3) & 0x1f) | bVar29;
            pmVar17 = (mchunkptr)(_gm_.smallbins + uVar36);
          }
          else {
            pmVar17 = _gm_.smallbins[uVar36 + 2];
            if (_gm_.smallbins[uVar36 + 2] < _gm_.least_addr) goto LAB_00105669;
          }
          _gm_.smallbins[uVar36 + 2] = _gm_.dv;
          pmVar17->bk = _gm_.dv;
          (_gm_.dv)->fd = pmVar17;
          (_gm_.dv)->bk = (mchunkptr)(_gm_.smallbins + uVar36);
        }
        goto LAB_00104917;
      }
    }
  }
  else if (bytes < 0xffffffffffffff80) {
    pmVar40 = (mstate)(bytes + 0x17 & 0xfffffffffffffff0);
    if (_gm_.treemap != 0) {
      uVar31 = (uint)(bytes + 0x17 >> 8);
      if (uVar31 == 0) {
        uVar18 = 0;
      }
      else if (uVar31 < 0x10000) {
        uVar34 = 0x1f;
        if (uVar31 != 0) {
          for (; uVar31 >> uVar34 == 0; uVar34 = uVar34 - 1) {
          }
        }
        uVar18 = (ulong)((uint)(((ulong)pmVar40 >>
                                 ((ulong)(byte)(0x26 - (char)(uVar34 ^ 0x1f)) & 0x3f) & 1) != 0) +
                         (uVar34 ^ 0x1f) * 2 ^ 0x3e);
      }
      else {
        uVar18 = 0x1f;
      }
      uVar36 = -(long)pmVar40;
      if (_gm_.treebins[uVar18] == (tbinptr)0x0) {
        pmVar25 = (tbinptr)0x0;
        pmVar12 = (tbinptr)0x0;
      }
      else {
        bVar37 = 0x39 - (char)(uVar18 >> 1);
        if ((int)uVar18 == 0x1f) {
          bVar37 = 0;
        }
        lVar33 = (long)pmVar40 << (bVar37 & 0x3f);
        pmVar25 = (tbinptr)0x0;
        pmVar10 = (tbinptr)0x0;
        pmVar27 = _gm_.treebins[uVar18];
        do {
          pmVar12 = pmVar27;
          uVar23 = (pmVar12->head & 0xfffffffffffffff8) - (long)pmVar40;
          if ((uVar23 < uVar36) && (pmVar10 = pmVar12, uVar36 = uVar23, uVar23 == 0)) {
            uVar36 = 0;
            pmVar25 = pmVar12;
            goto LAB_0010531f;
          }
          pmVar5 = pmVar12->child[1];
          pmVar27 = *(tbinptr *)((long)pmVar12 + (lVar33 >> 0x3f) * -8 + 0x20);
          pmVar12 = pmVar5;
          if (pmVar5 == pmVar27) {
            pmVar12 = pmVar25;
          }
          if (pmVar5 != (tbinptr)0x0) {
            pmVar25 = pmVar12;
          }
          lVar33 = lVar33 * 2;
          pmVar12 = pmVar10;
        } while (pmVar27 != (tbinptr)0x0);
      }
      if (pmVar25 != (tbinptr)0x0 || pmVar12 != (tbinptr)0x0) goto LAB_0010531f;
      uVar31 = 2 << ((byte)uVar18 & 0x1f);
      uVar31 = (-uVar31 | uVar31) & _gm_.treemap;
      if (uVar31 == 0) {
        pmVar12 = (tbinptr)0x0;
        pmVar25 = (tbinptr)0x0;
        goto LAB_0010531f;
      }
      uVar34 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
        }
      }
      ppmVar20 = _gm_.treebins + uVar34;
      pmVar12 = (tbinptr)0x0;
LAB_0010531c:
      pmVar25 = *ppmVar20;
LAB_0010531f:
      while (pmVar27 = pmVar25, pmVar27 != (tbinptr)0x0) {
        uVar18 = (pmVar27->head & 0xfffffffffffffff8) - (long)pmVar40;
        bVar41 = uVar18 < uVar36;
        if (bVar41) {
          uVar36 = uVar18;
        }
        if (bVar41) {
          pmVar12 = pmVar27;
        }
        pmVar25 = pmVar27->child[0];
        if (pmVar27->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00105346;
      }
      if ((pmVar12 == (tbinptr)0x0) || (_gm_.dvsize - (long)pmVar40 <= uVar36)) goto LAB_0010492a;
      if ((pmVar12 < _gm_.least_addr) || ((long)pmVar40 < 1)) goto LAB_00105669;
      pmVar25 = pmVar12->bk;
      pmVar35 = pmVar12->parent;
      if (pmVar25 != pmVar12) {
        pmVar3 = pmVar12->fd;
        if (((pmVar3 < _gm_.least_addr) || (pmVar3->bk != pmVar12)) || (pmVar25->fd != pmVar12))
        goto LAB_00105669;
        pmVar3->bk = pmVar25;
        pmVar25->fd = pmVar3;
        goto LAB_00105406;
      }
      if (pmVar12->child[1] != (tbinptr)0x0) {
        pmVar27 = pmVar12->child[1];
        ppmVar20 = pmVar12->child + 1;
        goto LAB_001053d9;
      }
      if (pmVar12->child[0] == (tbinptr)0x0) {
        pmVar25 = (tbinptr)0x0;
        goto LAB_00105406;
      }
      pmVar27 = pmVar12->child[0];
      ppmVar20 = pmVar12->child;
LAB_001053d9:
      do {
        do {
          ppmVar38 = ppmVar20;
          pmVar25 = pmVar27;
          pmVar27 = pmVar25->child[1];
          ppmVar20 = pmVar25->child + 1;
        } while (pmVar25->child[1] != (malloc_tree_chunk *)0x0);
        pmVar27 = pmVar25->child[0];
        ppmVar20 = pmVar25->child;
      } while (pmVar25->child[0] != (malloc_tree_chunk *)0x0);
      if (ppmVar38 < _gm_.least_addr) goto LAB_00105669;
      *ppmVar38 = (malloc_tree_chunk *)0x0;
LAB_00105406:
      pmVar27 = (tbinptr)_gm_.least_addr;
      if (pmVar35 != (malloc_tree_chunk *)0x0) {
        uVar31 = pmVar12->index;
        if (pmVar12 == _gm_.treebins[uVar31]) {
          _gm_.treebins[uVar31] = pmVar25;
          pmVar27 = (tbinptr)_gm_.least_addr;
          if (pmVar25 == (tbinptr)0x0) {
            _gm_.treemap = bVar8 & ~(1 << (uVar31 & 0x1f));
          }
          else {
LAB_00105458:
            if (pmVar25 < pmVar27) goto LAB_00105669;
            pmVar25->parent = pmVar35;
            pmVar10 = pmVar12->child[0];
            if (pmVar10 != (tbinptr)0x0) {
              if (pmVar10 < pmVar27) goto LAB_00105669;
              pmVar25->child[0] = pmVar10;
              pmVar10->parent = pmVar25;
            }
            pmVar10 = pmVar12->child[1];
            if (pmVar10 != (tbinptr)0x0) {
              if (pmVar10 < pmVar27) goto LAB_00105669;
              pmVar25->child[1] = pmVar10;
              pmVar10->parent = pmVar25;
            }
          }
        }
        else {
          if (pmVar35 < _gm_.least_addr) goto LAB_00105669;
          pmVar35->child[pmVar35->child[0] != pmVar12] = pmVar25;
          if (pmVar25 != (tbinptr)0x0) goto LAB_00105458;
        }
      }
      if (uVar36 < 0x20) {
        uVar18 = (long)pmVar40->smallbins + (uVar36 - 0x48);
        pmVar12->head = uVar18 | 3;
        pbVar2 = (byte *)((long)&pmVar12[-1].prev_foot + uVar18 + 0x48);
        *pbVar2 = *pbVar2 | 1;
        uVar18 = _gm_.dvsize;
        pmVar16 = _gm_.dv;
        goto LAB_00104917;
      }
      pmVar30 = (malloc_chunk *)((long)pmVar40->smallbins + (long)&pmVar12[-2].index);
      pmVar12->head = (ulong)pmVar40 | 3;
      *(ulong *)((long)&pmVar12->head + (long)pmVar40) = uVar36 | 1;
      *(ulong *)((long)&pmVar30->prev_foot + uVar36) = uVar36;
      if (0xff < uVar36) {
        uVar31 = (uint)(uVar36 >> 8);
        if (uVar31 == 0) {
          uVar31 = 0;
        }
        else if (uVar31 < 0x10000) {
          uVar34 = 0x1f;
          if (uVar31 != 0) {
            for (; uVar31 >> uVar34 == 0; uVar34 = uVar34 - 1) {
            }
          }
          uVar31 = (uint)((uVar36 >> ((ulong)(byte)(0x26 - (char)(uVar34 ^ 0x1f)) & 0x3f) & 1) != 0)
                   + (uVar34 ^ 0x1f) * 2 ^ 0x3e;
        }
        else {
          uVar31 = 0x1f;
        }
        pmVar32 = (malloc_chunk *)(_gm_.treebins + uVar31);
        *(uint *)&pmVar30[1].bk = uVar31;
        pmVar30[1].prev_foot = 0;
        pmVar30[1].head = 0;
        bVar37 = (byte)uVar31;
        if ((_gm_.treemap >> (uVar31 & 0x1f) & 1) == 0) goto LAB_00105615;
        bVar37 = 0x39 - (char)(uVar31 >> 1);
        if (uVar31 == 0x1f) {
          bVar37 = 0;
        }
        lVar33 = uVar36 << (bVar37 & 0x3f);
        pmVar32 = (malloc_chunk *)pmVar32->prev_foot;
        do {
          pmVar21 = pmVar32;
          if ((pmVar21->head & 0xfffffffffffffff8) == uVar36) goto LAB_00105633;
          lVar19 = lVar33 >> 0x3f;
          lVar33 = lVar33 * 2;
          pmVar32 = *(malloc_chunk **)((long)pmVar21 + lVar19 * -8 + 0x20);
        } while (pmVar32 != (malloc_chunk *)0x0);
        goto LAB_001055fb;
      }
      goto LAB_001054f7;
    }
  }
  else {
    pmVar40 = (mstate)0xffffffffffffffff;
  }
LAB_0010492a:
  uVar18 = _gm_.dvsize - (long)pmVar40;
  if (pmVar40 <= _gm_.dvsize) {
    pmVar12 = (tbinptr)_gm_.dv;
    if (uVar18 < 0x20) {
      (_gm_.dv)->head = _gm_.dvsize | 3;
      pbVar2 = (byte *)((long)&(_gm_.dv)->head + _gm_.dvsize);
      *pbVar2 = *pbVar2 | 1;
      uVar18 = 0;
      pmVar16 = (mchunkptr)0x0;
    }
    else {
      *(ulong *)((long)&(_gm_.dv)->head + (long)pmVar40) = uVar18 | 1;
      *(ulong *)((long)&(_gm_.dv)->prev_foot + _gm_.dvsize) = uVar18;
      (_gm_.dv)->head = (ulong)pmVar40 | 3;
      pmVar16 = (mchunkptr)((long)pmVar40->smallbins + (long)&_gm_.dv[-3].bk);
    }
    goto LAB_00104917;
  }
  uVar18 = _gm_.topsize - (long)pmVar40;
  if (_gm_.topsize < pmVar40 || uVar18 == 0) {
    if (mparams.magic == 0) {
      init_mparams();
    }
    if (((((byte)_gm_.mflags & 1) != 0) && (mparams.mmap_threshold <= pmVar40)) &&
       (_gm_.topsize != 0)) {
      pmVar24 = (mstate)(-mparams.page_size & (long)pmVar40->smallbins + (mparams.page_size - 10));
      if (_gm_.footprint_limit == 0) {
        if (pmVar40 < pmVar24) goto LAB_00104a5b;
      }
      else {
        uVar18 = (long)pmVar24->smallbins + (_gm_.footprint - 0x48);
        if ((pmVar40 < pmVar24 && _gm_.footprint < uVar18) && uVar18 <= _gm_.footprint_limit) {
LAB_00104a5b:
          pcVar11 = (char *)mmap((void *)0x0,(size_t)pmVar24,3,0x22,-1,0);
          if (pcVar11 != (char *)0xffffffffffffffff) {
            uVar18 = (ulong)(-(int)pcVar11 - 0x10U & 0xf);
            pmVar12 = (tbinptr)(pcVar11 + uVar18);
            *(ulong *)(pcVar11 + uVar18) = uVar18;
            *(char **)(pcVar11 + uVar18 + 8) = (char *)((long)pmVar24 + (-0x20 - uVar18));
            pcVar9 = (char *)((long)pmVar24 + (-0x18 - uVar18)) + (long)pmVar12;
            pcVar9[0] = '\v';
            pcVar9[1] = '\0';
            pcVar9[2] = '\0';
            pcVar9[3] = '\0';
            pcVar9[4] = '\0';
            pcVar9[5] = '\0';
            pcVar9[6] = '\0';
            pcVar9[7] = '\0';
            pcVar9 = pcVar11 + -0x10 + (long)pmVar24;
            pcVar9[0] = '\0';
            pcVar9[1] = '\0';
            pcVar9[2] = '\0';
            pcVar9[3] = '\0';
            pcVar9[4] = '\0';
            pcVar9[5] = '\0';
            pcVar9[6] = '\0';
            pcVar9[7] = '\0';
            if ((_gm_.least_addr == (char *)0x0) || (pcVar11 < _gm_.least_addr)) {
              _gm_.least_addr = pcVar11;
            }
            _gm_.footprint = (long)pmVar24->smallbins + (_gm_.footprint - 0x48);
            uVar18 = _gm_.dvsize;
            pmVar16 = _gm_.dv;
            if (_gm_.max_footprint < _gm_.footprint) {
              _gm_.max_footprint = _gm_.footprint;
            }
            goto LAB_00104917;
          }
        }
      }
    }
    pmVar24 = (mstate)(-mparams.granularity & (long)pmVar40->smallbins + mparams.granularity + 0x17)
    ;
    if (pmVar24 <= pmVar40) {
      return (malloc_tree_chunk **)0x0;
    }
    if ((_gm_.footprint_limit != 0) &&
       (uVar18 = (long)pmVar24->smallbins + (_gm_.footprint - 0x48),
       _gm_.footprint_limit < uVar18 || uVar18 <= _gm_.footprint)) {
      return (malloc_tree_chunk **)0x0;
    }
    addr = pmVar24;
    m = (mstate)mmap((void *)0x0,(size_t)pmVar24,3,0x22,-1,0);
    pmVar16 = _gm_.top;
    if (m == (mstate)0xffffffffffffffff) goto LAB_00105088;
    _gm_.footprint = (long)pmVar24->smallbins + (_gm_.footprint - 0x48);
    if (_gm_.max_footprint < _gm_.footprint) {
      _gm_.max_footprint = _gm_.footprint;
    }
    if (_gm_.top == (mchunkptr)0x0) {
      if ((_gm_.least_addr == (char *)0x0) || (m < _gm_.least_addr)) {
        _gm_.least_addr = (char *)m;
      }
      lVar33 = 0x20;
      _gm_.seg.sflags = 1;
      _gm_.magic = mparams.magic;
      _gm_.release_checks = 0xfff;
      lVar19 = 0x10c190;
      _gm_.seg.base = (char *)m;
      _gm_.seg.size = (size_t)pmVar24;
      while (bVar41 = lVar33 != 0, lVar33 = lVar33 + -1, bVar41) {
        *(long *)(lVar19 + 0x18) = lVar19;
        *(long *)(lVar19 + 0x10) = lVar19;
        lVar19 = lVar19 + 0x10;
      }
      pmVar17 = (mchunkptr)&pmVar24[-1].footprint;
      sVar22 = extraout_RDX;
LAB_00104c4b:
      init_top(m,pmVar17,sVar22);
      goto LAB_00105078;
    }
    for (pmVar13 = &_gm_.seg; pmVar13 != (malloc_segment *)0x0; pmVar13 = pmVar13->next) {
      addr = (mstate)((long)&((mchunkptr)pmVar13->base)->prev_foot + pmVar13->size);
      if (m == addr) {
        if ((_gm_.top < m) && ((mchunkptr)pmVar13->base <= _gm_.top)) {
          uVar31 = pmVar13->sflags;
          sVar22 = (size_t)uVar31;
          addr = (mstate)(ulong)(uVar31 & 8);
          if (((uVar31 & 8) == 0) && ((uVar31 & 1) != 0)) {
            pmVar13->size = (long)pmVar24->smallbins + (pmVar13->size - 0x48);
            pmVar17 = (mchunkptr)((long)pmVar24->smallbins + (_gm_.topsize - 0x48));
            m = (mstate)pmVar16;
            goto LAB_00104c4b;
          }
        }
        break;
      }
    }
    if (m < _gm_.least_addr) {
      _gm_.least_addr = (char *)m;
    }
    pcVar9 = _gm_.least_addr;
    pcVar11 = (char *)((long)(((malloc_state *)
                              (((malloc_state *)(pmVar24->smallbins + -9))->smallbins + -9))->
                              smallbins + 0xfffffffffffffff7) +
                      (long)((malloc_state *)
                            (((malloc_state *)
                             (((malloc_state *)(m->smallbins + -9))->smallbins + -9))->smallbins +
                            -9))->smallbins + 0xffffffffffffffb8U);
    pmVar13 = &_gm_.seg;
    while( true ) {
      if (pmVar13 == (malloc_segment *)0x0) goto LAB_00104d78;
      pcVar4 = pmVar13->base;
      if (pcVar4 == pcVar11) break;
      pmVar13 = pmVar13->next;
    }
    bVar37 = (byte)pmVar13->sflags;
    uVar18 = CONCAT71((int7)((ulong)pcVar11 >> 8),bVar37) & 0xffffffff;
    bVar28 = (byte)uVar18 >> 3;
    addr = (mstate)CONCAT71((int7)(uVar18 >> 8),bVar28);
    if (((~bVar37 | bVar28) & 1) != 0) goto LAB_00104d78;
    pmVar13->base = (char *)m;
    pmVar13->size = (long)pmVar24->smallbins + (pmVar13->size - 0x48);
    uVar18 = (ulong)(-(int)m - 0x10U & 0xf);
    pmVar12 = (tbinptr)((long)m->smallbins + (uVar18 - 0x48));
    pmVar25 = (tbinptr)(pcVar4 + (-(int)pcVar4 - 0x10U & 0xf));
    pmVar30 = (malloc_chunk *)((long)pmVar40->smallbins + (long)&pmVar12[-2].index);
    uVar36 = (long)pmVar25 - (long)pmVar30;
    *(ulong *)((long)m->smallbins + (uVar18 - 0x40)) = (ulong)pmVar40 | 3;
    if (pmVar25 == (tbinptr)pmVar16) {
      _gm_.topsize = uVar36 + _gm_.topsize;
      _gm_.top = pmVar30;
      pmVar30->head = _gm_.topsize | 1;
      uVar18 = _gm_.dvsize;
      pmVar16 = _gm_.dv;
      goto LAB_00104917;
    }
    if (pmVar25 == (tbinptr)_gm_.dv) {
      uVar36 = uVar36 + _gm_.dvsize;
      _gm_.dvsize = uVar36;
      _gm_.dv = pmVar30;
      pmVar30->head = uVar36 | 1;
      *(ulong *)((long)pmVar30 + uVar36) = uVar36;
      uVar18 = _gm_.dvsize;
      pmVar16 = _gm_.dv;
      goto LAB_00104917;
    }
    uVar18 = pmVar25->head;
    pmVar27 = pmVar25;
    if (((uint)uVar18 & 3) != 1) goto LAB_00105217;
    if (uVar18 < 0x100) {
      pmVar35 = pmVar25->fd;
      pmVar3 = pmVar25->bk;
      if ((pmVar35 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar18 >> 3) * 2)) &&
         ((pmVar35 < pcVar9 || (pmVar35->bk != pmVar25)))) goto LAB_00105669;
      if (pmVar3 == pmVar35) {
        bVar37 = (byte)(uVar18 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar37 | 0xfffffffeU >> 0x20 - bVar37);
        goto LAB_00105204;
      }
      if ((pmVar3 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar18 >> 3) * 2)) &&
         ((pmVar3 < pcVar9 || (pmVar3->fd != pmVar25)))) goto LAB_00105669;
      pmVar35->bk = pmVar3;
      pmVar3->fd = pmVar35;
      goto LAB_00105204;
    }
    pmVar27 = pmVar25->bk;
    pmVar35 = pmVar25->parent;
    if (pmVar27 != pmVar25) {
      pmVar3 = pmVar25->fd;
      if (((pmVar3 < pcVar9) || (pmVar3->bk != pmVar25)) || (pmVar27->fd != pmVar25))
      goto LAB_00105669;
      pmVar3->bk = pmVar27;
      pmVar27->fd = pmVar3;
      goto LAB_0010515b;
    }
    if (pmVar25->child[1] != (tbinptr)0x0) {
      pmVar10 = pmVar25->child[1];
      ppmVar20 = pmVar25->child + 1;
      goto LAB_0010512e;
    }
    if (pmVar25->child[0] == (tbinptr)0x0) {
      pmVar27 = (tbinptr)0x0;
      goto LAB_0010515b;
    }
    pmVar10 = pmVar25->child[0];
    ppmVar20 = pmVar25->child;
LAB_0010512e:
    do {
      do {
        ppmVar38 = ppmVar20;
        pmVar27 = pmVar10;
        pmVar10 = pmVar27->child[1];
        ppmVar20 = pmVar27->child + 1;
      } while (pmVar27->child[1] != (malloc_tree_chunk *)0x0);
      pmVar10 = pmVar27->child[0];
      ppmVar20 = pmVar27->child;
    } while (pmVar27->child[0] != (malloc_tree_chunk *)0x0);
    if (ppmVar38 < pcVar9) goto LAB_00105669;
    *ppmVar38 = (malloc_tree_chunk *)0x0;
LAB_0010515b:
    pmVar10 = (tbinptr)_gm_.least_addr;
    if (pmVar35 != (malloc_tree_chunk *)0x0) {
      uVar31 = pmVar25->index;
      if (pmVar25 == _gm_.treebins[uVar31]) {
        _gm_.treebins[uVar31] = pmVar27;
        pmVar10 = (tbinptr)_gm_.least_addr;
        if (pmVar27 == (tbinptr)0x0) {
          bVar37 = (byte)uVar31 & 0x1f;
          _gm_.treemap = _gm_.treemap & (-2 << bVar37 | 0xfffffffeU >> 0x20 - bVar37);
        }
        else {
LAB_001051b3:
          if (pmVar27 < pmVar10) goto LAB_00105669;
          pmVar27->parent = pmVar35;
          pmVar5 = pmVar25->child[0];
          if (pmVar5 != (tbinptr)0x0) {
            if (pmVar5 < pmVar10) goto LAB_00105669;
            pmVar27->child[0] = pmVar5;
            pmVar5->parent = pmVar27;
          }
          pmVar5 = pmVar25->child[1];
          if (pmVar5 != (tbinptr)0x0) {
            if (pmVar5 < pmVar10) goto LAB_00105669;
            pmVar27->child[1] = pmVar5;
            pmVar5->parent = pmVar27;
          }
        }
      }
      else {
        if (pmVar35 < _gm_.least_addr) goto LAB_00105669;
        pmVar35->child[pmVar35->child[0] != pmVar25] = pmVar27;
        if (pmVar27 != (tbinptr)0x0) goto LAB_001051b3;
      }
    }
LAB_00105204:
    uVar18 = uVar18 & 0xfffffffffffffff8;
    pmVar27 = (tbinptr)((long)&pmVar25->prev_foot + uVar18);
    uVar36 = uVar36 + uVar18;
    uVar18 = *(ulong *)((long)&pmVar25->head + uVar18);
LAB_00105217:
    pmVar27->head = uVar18 & 0xfffffffffffffffe;
    pmVar30->head = uVar36 | 1;
    *(ulong *)((long)&pmVar30->prev_foot + uVar36) = uVar36;
    if (uVar36 < 0x100) {
LAB_001054f7:
      uVar36 = uVar36 >> 3;
      if ((_gm_.smallmap >> ((uint)uVar36 & 0x1f) & 1) == 0) {
        _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar36 & 0x1f);
        pmVar16 = (malloc_chunk *)(_gm_.smallbins + uVar36 * 2);
      }
      else {
        pmVar16 = _gm_.smallbins[uVar36 * 2 + 2];
        if (_gm_.smallbins[uVar36 * 2 + 2] < _gm_.least_addr) {
LAB_00105669:
          abort();
        }
      }
      _gm_.smallbins[uVar36 * 2 + 2] = pmVar30;
      pmVar16->bk = pmVar30;
      pmVar30->fd = pmVar16;
      pmVar30->bk = (malloc_chunk *)(_gm_.smallbins + uVar36 * 2);
      uVar18 = _gm_.dvsize;
      pmVar16 = _gm_.dv;
    }
    else {
      uVar31 = (uint)(uVar36 >> 8);
      if (uVar31 == 0) {
        uVar31 = 0;
      }
      else if (uVar31 < 0x10000) {
        uVar34 = 0x1f;
        if (uVar31 != 0) {
          for (; uVar31 >> uVar34 == 0; uVar34 = uVar34 - 1) {
          }
        }
        uVar31 = (uint)((uVar36 >> ((ulong)(byte)(0x26 - (char)(uVar34 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar34 ^ 0x1f) * 2 ^ 0x3e;
      }
      else {
        uVar31 = 0x1f;
      }
      pmVar32 = (malloc_chunk *)(_gm_.treebins + uVar31);
      *(uint *)&pmVar30[1].bk = uVar31;
      pmVar30[1].prev_foot = 0;
      pmVar30[1].head = 0;
      bVar37 = (byte)uVar31;
      if ((_gm_.treemap >> (uVar31 & 0x1f) & 1) == 0) {
LAB_00105615:
        _gm_.treemap = _gm_.treemap | 1 << (bVar37 & 0x1f);
        pmVar32->prev_foot = (size_t)pmVar30;
        pmVar30[1].fd = pmVar32;
      }
      else {
        bVar37 = 0x39 - (char)(uVar31 >> 1);
        if (uVar31 == 0x1f) {
          bVar37 = 0;
        }
        lVar33 = uVar36 << (bVar37 & 0x3f);
        pmVar32 = (malloc_chunk *)pmVar32->prev_foot;
        do {
          pmVar21 = pmVar32;
          if ((pmVar21->head & 0xfffffffffffffff8) == uVar36) goto LAB_00105633;
          lVar19 = lVar33 >> 0x3f;
          lVar33 = lVar33 * 2;
          pmVar32 = *(malloc_chunk **)((long)pmVar21 + lVar19 * -8 + 0x20);
        } while (pmVar32 != (malloc_chunk *)0x0);
LAB_001055fb:
        pcVar11 = (char *)((long)pmVar21 + lVar19 * -8 + 0x20);
        if (pcVar11 < _gm_.least_addr) goto LAB_00105669;
        *(malloc_chunk **)pcVar11 = pmVar30;
        pmVar30[1].fd = pmVar21;
      }
      pmVar30->bk = pmVar30;
      pmVar30->fd = pmVar30;
      uVar18 = _gm_.dvsize;
      pmVar16 = _gm_.dv;
    }
    goto LAB_00104917;
  }
  goto LAB_00104948;
code_r0x00105346:
  ppmVar20 = pmVar27->child + 1;
  goto LAB_0010531c;
LAB_00105633:
  if ((pmVar21 < _gm_.least_addr) || (pmVar32 = pmVar21->fd, pmVar32 < _gm_.least_addr))
  goto LAB_00105669;
  pmVar32->bk = pmVar30;
  pmVar21->fd = pmVar30;
  pmVar30->fd = pmVar32;
  pmVar30->bk = pmVar21;
  pmVar30[1].fd = (malloc_chunk *)0x0;
  uVar18 = _gm_.dvsize;
  pmVar16 = _gm_.dv;
  goto LAB_00104917;
LAB_00104d78:
  pmVar14 = segment_holding((mstate)_gm_.top,(char *)addr);
  pmVar39 = (mchunkptr)(pmVar14->base + pmVar14->size);
  pmVar26 = (mchunkptr)((long)pmVar39 + ((ulong)(0x4fU - (int)pmVar39 & 0xf) - 0x5f));
  pmVar17 = pmVar16 + 1;
  if (pmVar26 < pmVar17) {
    pmVar26 = pmVar16;
  }
  init_top(m,(mchunkptr)&pmVar24[-1].footprint,psize);
  pmVar26->head = 0x33;
  sVar22 = CONCAT44(_gm_.seg._28_4_,_gm_.seg.sflags);
  pmVar26[1].prev_foot = (size_t)_gm_.seg.next;
  pmVar26[1].head = sVar22;
  pmVar26->fd = (malloc_chunk *)_gm_.seg.base;
  pmVar26->bk = (malloc_chunk *)_gm_.seg.size;
  auVar7 = _DAT_00109020;
  auVar6 = _DAT_00109010;
  if (pmVar39 <= pmVar26 + 2) {
    pmVar39 = pmVar26 + 2;
  }
  uVar36 = (long)pmVar39 + (-0x39 - (long)pmVar26);
  auVar44._8_4_ = (int)uVar36;
  auVar44._0_8_ = uVar36;
  auVar44._12_4_ = (int)(uVar36 >> 0x20);
  auVar42._0_8_ = uVar36 >> 3;
  auVar42._8_8_ = auVar44._8_8_ >> 3;
  uVar18 = 0;
  auVar42 = auVar42 ^ _DAT_00109020;
  _gm_.seg.base = (char *)m;
  _gm_.seg.size = (size_t)pmVar24;
  _gm_.seg.next = (malloc_segment *)&pmVar26->fd;
  _gm_.seg.sflags = (uint)(m != (mstate)0xffffffffffffffff);
  do {
    auVar43._8_4_ = (int)uVar18;
    auVar43._0_8_ = uVar18;
    auVar43._12_4_ = (int)(uVar18 >> 0x20);
    auVar44 = (auVar43 | auVar6) ^ auVar7;
    if ((bool)(~(auVar44._4_4_ == auVar42._4_4_ && auVar42._0_4_ < auVar44._0_4_ ||
                auVar42._4_4_ < auVar44._4_4_) & 1)) {
      (&pmVar26[1].bk)[uVar18] = (malloc_chunk *)0xb;
    }
    if ((auVar44._12_4_ != auVar42._12_4_ || auVar44._8_4_ <= auVar42._8_4_) &&
        auVar44._12_4_ <= auVar42._12_4_) {
      (&pmVar26[2].prev_foot)[uVar18] = 0xb;
    }
    uVar18 = uVar18 + 2;
  } while (((uVar36 >> 3) + 2 & 0xfffffffffffffffe) != uVar18);
  uVar18 = (long)pmVar26 - (long)pmVar16;
  if (uVar18 != 0) {
    *(byte *)&pmVar26->head = (byte)pmVar26->head & 0xfe;
    pmVar16->head = uVar18 | 1;
    pmVar26->prev_foot = uVar18;
    if (uVar18 < 0x100) {
      uVar18 = uVar18 >> 3;
      if ((_gm_.smallmap >> ((uint)uVar18 & 0x1f) & 1) == 0) {
        _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar18 & 0x1f);
        pmVar25 = (tbinptr)(_gm_.smallbins + uVar18 * 2);
      }
      else {
        pmVar25 = (tbinptr)_gm_.smallbins[uVar18 * 2 + 2];
        if ((tbinptr)_gm_.smallbins[uVar18 * 2 + 2] < _gm_.least_addr) goto LAB_00105669;
      }
      _gm_.smallbins[uVar18 * 2 + 2] = pmVar16;
      pmVar25->bk = (malloc_tree_chunk *)pmVar16;
      lVar33 = 0x18;
      lVar19 = 0x10;
      pmVar12 = (tbinptr)(_gm_.smallbins + uVar18 * 2);
    }
    else {
      uVar31 = (uint)(uVar18 >> 8);
      if (uVar31 == 0) {
        uVar31 = 0;
      }
      else if (uVar31 < 0x10000) {
        uVar34 = 0x1f;
        if (uVar31 != 0) {
          for (; uVar31 >> uVar34 == 0; uVar34 = uVar34 - 1) {
          }
        }
        uVar31 = (uint)((uVar18 >> ((ulong)(byte)(0x26 - (char)(uVar34 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar34 ^ 0x1f) * 2 ^ 0x3e;
      }
      else {
        uVar31 = 0x1f;
      }
      pmVar30 = (malloc_chunk *)(_gm_.treebins + uVar31);
      *(uint *)&pmVar16[1].bk = uVar31;
      pmVar17->prev_foot = 0;
      pmVar17->head = 0;
      if ((_gm_.treemap >> (uVar31 & 0x1f) & 1) == 0) {
        _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar31 & 0x1f);
        pmVar30->prev_foot = (size_t)pmVar16;
        pmVar16[1].fd = pmVar30;
      }
      else {
        bVar37 = 0x39 - (char)(uVar31 >> 1);
        if (uVar31 == 0x1f) {
          bVar37 = 0;
        }
        lVar33 = uVar18 << (bVar37 & 0x3f);
        pmVar12 = (tbinptr)pmVar30->prev_foot;
        do {
          pmVar25 = pmVar12;
          if ((pmVar25->head & 0xfffffffffffffff8) == uVar18) {
            if ((pmVar25 < _gm_.least_addr) || (pmVar35 = pmVar25->fd, pmVar35 < _gm_.least_addr))
            goto LAB_00105669;
            pmVar35->bk = (malloc_tree_chunk *)pmVar16;
            pmVar25->fd = (malloc_tree_chunk *)pmVar16;
            pmVar16->fd = (malloc_chunk *)pmVar35;
            lVar33 = 0x30;
            lVar19 = 0x18;
            pmVar12 = (tbinptr)0x0;
            goto LAB_00105070;
          }
          lVar19 = lVar33 >> 0x3f;
          lVar33 = lVar33 * 2;
          pmVar12 = *(tbinptr *)((long)pmVar25 + lVar19 * -8 + 0x20);
        } while (pmVar12 != (tbinptr)0x0);
        pcVar11 = (char *)((long)pmVar25 + lVar19 * -8 + 0x20);
        if (pcVar11 < _gm_.least_addr) goto LAB_00105669;
        *(mchunkptr *)pcVar11 = pmVar16;
        pmVar16[1].fd = (malloc_chunk *)pmVar25;
      }
      lVar33 = 0x10;
      lVar19 = 0x18;
      pmVar25 = (tbinptr)pmVar16;
      pmVar12 = (tbinptr)pmVar16;
    }
LAB_00105070:
    *(tbinptr *)((long)&pmVar16->prev_foot + lVar19) = pmVar25;
    *(tbinptr *)((long)&pmVar16->prev_foot + lVar33) = pmVar12;
  }
LAB_00105078:
  uVar18 = _gm_.topsize - (long)pmVar40;
  if (_gm_.topsize < pmVar40 || uVar18 == 0) {
LAB_00105088:
    piVar15 = __errno_location();
    *piVar15 = 0xc;
    return (malloc_tree_chunk **)0x0;
  }
LAB_00104948:
  pmVar12 = (tbinptr)_gm_.top;
  psVar1 = &(_gm_.top)->head;
  _gm_.topsize = uVar18;
  _gm_.top = (mchunkptr)((long)pmVar40->smallbins + (long)&_gm_.top[-3].bk);
  *(ulong *)((long)psVar1 + (long)pmVar40) = uVar18 | 1;
  ((mchunkptr)pmVar12)->head = (ulong)pmVar40 | 3;
  uVar18 = _gm_.dvsize;
  pmVar16 = _gm_.dv;
LAB_00104917:
  _gm_.dv = pmVar16;
  _gm_.dvsize = uVar18;
  return &pmVar12->fd;
}

Assistant:

void* dlmalloc(size_t bytes) {
  /*
     Basic algorithm:
     If a small request (< 256 bytes minus per-chunk overhead):
       1. If one exists, use a remainderless chunk in associated smallbin.
          (Remainderless means that there are too few excess bytes to
          represent as a chunk.)
       2. If it is big enough, use the dv chunk, which is normally the
          chunk adjacent to the one used for the most recent small request.
       3. If one exists, split the smallest available chunk in a bin,
          saving remainder in dv.
       4. If it is big enough, use the top chunk.
       5. If available, get memory from system and use it
     Otherwise, for a large request:
       1. Find the smallest available binned chunk that fits, and use it
          if it is better fitting than dv chunk, splitting if necessary.
       2. If better fitting than any binned chunk, use the dv chunk.
       3. If it is big enough, use the top chunk.
       4. If request size >= mmap threshold, try to directly mmap this chunk.
       5. If available, get memory from system and use it

     The ugly goto's here ensure that postaction occurs along all paths.
  */

#if USE_LOCKS
  ensure_initialization(); /* initialize in sys_alloc if not using locks */
#endif

  if (!PREACTION(gm)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = gm->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(gm, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(gm, b, p, idx);
        set_inuse_and_pinuse(gm, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }

      else if (nb > gm->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(gm, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(gm, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(gm, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(gm, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }

        else if (gm->treemap != 0 && (mem = tmalloc_small(gm, nb)) != 0) {
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (gm->treemap != 0 && (mem = tmalloc_large(gm, nb)) != 0) {
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }
    }

    if (nb <= gm->dvsize) {
      size_t rsize = gm->dvsize - nb;
      mchunkptr p = gm->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = gm->dv = chunk_plus_offset(p, nb);
        gm->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = gm->dvsize;
        gm->dvsize = 0;
        gm->dv = 0;
        set_inuse_and_pinuse(gm, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    else if (nb < gm->topsize) { /* Split top */
      size_t rsize = gm->topsize -= nb;
      mchunkptr p = gm->top;
      mchunkptr r = gm->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(gm, gm->top);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(gm, nb);

  postaction:
    POSTACTION(gm);
    return mem;
  }

  return 0;
}